

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
btBvhTriangleMeshShape::performConvexcast::MyNodeOverlapCallback::processNode
          (MyNodeOverlapCallback *this,int nodeSubPart,int nodeTriangleIndex)

{
  float fVar1;
  btStridingMeshInterface *pbVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  float fVar7;
  PHY_ScalarType indicestype;
  int stride;
  uchar *vertexbase;
  int numfaces;
  int indexstride;
  PHY_ScalarType type;
  int numverts;
  uchar *indexbase;
  btVector3 m_triangle [3];
  
  (*this->m_meshInterface->_vptr_btStridingMeshInterface[4])
            (this->m_meshInterface,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,
             &numfaces,&indicestype,nodeSubPart);
  pbVar2 = this->m_meshInterface;
  lVar3 = 0;
  do {
    if (indicestype == PHY_SHORT) {
      uVar4 = (uint)*(ushort *)(indexbase + lVar3 + (long)(indexstride * nodeTriangleIndex) + 4);
    }
    else {
      uVar4 = *(uint *)(indexbase + lVar3 * 2 + (long)(indexstride * nodeTriangleIndex) + 8);
    }
    lVar5 = (long)(int)uVar4 * (long)stride;
    if (type == PHY_FLOAT) {
      uVar6 = *(undefined8 *)(pbVar2->m_scaling).m_floats;
      uVar6 = CONCAT44((float)((ulong)uVar6 >> 0x20) *
                       (float)((ulong)*(undefined8 *)(vertexbase + lVar5) >> 0x20),
                       (float)uVar6 * (float)*(undefined8 *)(vertexbase + lVar5));
      fVar7 = *(float *)(vertexbase + lVar5 + 8);
    }
    else {
      fVar7 = (float)*(double *)(vertexbase + lVar5 + 0x10);
      uVar6 = *(undefined8 *)(pbVar2->m_scaling).m_floats;
      uVar6 = CONCAT44((float)((ulong)uVar6 >> 0x20) *
                       (float)*(double *)((long)(vertexbase + lVar5) + 8),
                       (float)uVar6 * (float)*(double *)(vertexbase + lVar5));
    }
    fVar1 = (pbVar2->m_scaling).m_floats[2];
    *(undefined8 *)(m_triangle[2].m_floats + lVar3 * 2) = uVar6;
    m_triangle[2].m_floats[lVar3 * 2 + 2] = fVar7 * fVar1;
    m_triangle[2].m_floats[lVar3 * 2 + 3] = 0.0;
    lVar3 = lVar3 + -2;
  } while (lVar3 != -6);
  (*this->m_callback->_vptr_btTriangleCallback[2])
            (this->m_callback,m_triangle,nodeSubPart,(ulong)(uint)nodeTriangleIndex);
  (*this->m_meshInterface->_vptr_btStridingMeshInterface[6])(this->m_meshInterface,nodeSubPart);
  return;
}

Assistant:

virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			btVector3 m_triangle[3];
			const unsigned char *vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char *indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase+nodeTriangleIndex*indexstride);
			btAssert(indicestype==PHY_INTEGER||indicestype==PHY_SHORT);
	
			const btVector3& meshScaling = m_meshInterface->getScaling();
			for (int j=2;j>=0;j--)
			{
				int graphicsindex = indicestype==PHY_SHORT?((unsigned short*)gfxbase)[j]:gfxbase[j];

				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase+graphicsindex*stride);

					m_triangle[j] = btVector3(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());		
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase+graphicsindex*stride);
					
					m_triangle[j] = btVector3(btScalar(graphicsbase[0])*meshScaling.getX(),btScalar(graphicsbase[1])*meshScaling.getY(),btScalar(graphicsbase[2])*meshScaling.getZ());		
				}
			}

			/* Perform ray vs. triangle collision here */
			m_callback->processTriangle(m_triangle,nodeSubPart,nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}